

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

bool __thiscall
slang::ast::Bitstream::canBeSource
          (Bitstream *this,Type *target,StreamingConcatenationExpression *rhs,
          SourceRange assignmentRange,ASTContext *context)

{
  ulong uVar1;
  SourceRange range;
  bool bVar2;
  ulong in_RAX;
  Diagnostic *pDVar3;
  SourceLocation this_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  ulong local_38;
  
  this_00 = assignmentRange.endLoc;
  sourceRange.endLoc = assignmentRange.startLoc;
  local_38 = in_RAX;
  bVar2 = Type::isBitstreamType((Type *)this,true);
  if (bVar2) {
    if ((((bitmask<slang::ast::ASTFlags> *)((long)this_00 + 0x10))->m_bits & 2) != 0) {
      return true;
    }
    bVar2 = Type::isFixedSize((Type *)this);
    if (!bVar2) {
      return true;
    }
    local_38 = Type::getBitstreamWidth((Type *)this);
    uVar1 = *(ulong *)&target[1].super_Symbol;
    if (uVar1 <= local_38) {
      return uVar1 <= local_38;
    }
    sourceRange.startLoc = (SourceLocation)rhs;
    pDVar3 = ASTContext::addDiag((ASTContext *)this_00,(DiagCode)0x2c0007,sourceRange);
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&pDVar3->args,&local_38);
    local_38 = uVar1;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&pDVar3->args,&local_38);
  }
  else {
    sourceRange_00.endLoc = sourceRange.endLoc;
    sourceRange_00.startLoc = (SourceLocation)rhs;
    pDVar3 = ASTContext::addDiag((ASTContext *)this_00,(DiagCode)0x2f0007,sourceRange_00);
    pDVar3 = ast::operator<<(pDVar3,(Type *)this);
  }
  range.startLoc = (SourceLocation)(target->super_Symbol).parentScope;
  range.endLoc = (SourceLocation)(target->super_Symbol).nextInScope;
  Diagnostic::operator<<(pDVar3,range);
  return false;
}

Assistant:

bool Bitstream::canBeSource(const Type& target, const StreamingConcatenationExpression& rhs,
                            SourceRange assignmentRange, const ASTContext& context) {
    // No need to checkClassAccess here because a class is never a valid
    // destination bitstream type.
    if (!target.isBitstreamType(true)) {
        context.addDiag(diag::BadStreamTargetType, assignmentRange) << target << rhs.sourceRange;
        return false;
    }

    if (context.inUnevaluatedBranch())
        return true; // No size check in an unevaluated conditional branch
    if (!target.isFixedSize())
        return true; // Sizes checked at constant evaluation or runtime

    auto targetWidth = target.getBitstreamWidth();
    auto sourceWidth = rhs.getBitstreamWidth();
    if (targetWidth < sourceWidth) {
        auto& diag = context.addDiag(diag::BadStreamSize, assignmentRange)
                     << targetWidth << sourceWidth;
        diag << rhs.sourceRange;
        return false;
    }

    return true;
}